

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

int WaitForProcess(pid_t pid,timespec *ts,rusage *rusage)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  int nanosleepStatus;
  pid_t child;
  int status;
  rusage *rusage_local;
  timespec *ts_local;
  pid_t pid_local;
  
  _child = rusage;
  rusage_local = (rusage *)ts;
  ts_local._0_4_ = pid;
  while( true ) {
    bVar1 = true;
    if ((rusage_local->ru_utime).tv_sec < 1) {
      bVar1 = 0 < (rusage_local->ru_utime).tv_usec;
    }
    if (!bVar1) {
      return 0;
    }
    nanosleepStatus = 0;
    _Var2 = wait4((pid_t)ts_local,&nanosleepStatus,1,(rusage *)_child);
    if (_Var2 != 0) break;
    iVar3 = nanosleep((timespec *)rusage_local,(timespec *)rusage_local);
    if (iVar3 == 0) {
      return 0;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 4) {
      __assert_fail("errno == EINTR",
                    "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                    ,0x1ee,"int WaitForProcess(pid_t, struct timespec *, struct rusage *)");
    }
  }
  if (_Var2 == -1) {
    return 4;
  }
  if ((nanosleepStatus & 0x7fU) == 0) {
    if ((int)(nanosleepStatus & 0xff00U) >> 8 == 0) {
      return 3;
    }
    return 2;
  }
  if ('\0' < (char)(((byte)nanosleepStatus & 0x7f) + 1) >> 1) {
    return 1;
  }
  return 4;
}

Assistant:

static int WaitForProcess(pid_t pid, struct timespec* ts, struct rusage* rusage) {
    while (ts->tv_sec > 0 || ts->tv_nsec > 0) {
        int status = 0;
        pid_t child = wait4(pid, &status, WNOHANG, rusage);
        if (child == 0) {
            int nanosleepStatus = nanosleep(ts, ts);
            if (nanosleepStatus == 0) {
                return Timeout;
            }
            assert(errno == EINTR);
        } else if (child == -1) {
            return WaitError;
        } else if (WIFEXITED(status)) {
            if (WEXITSTATUS(status) == 0) {
                return OK;
            } else {
                return NonZeroStatus;
            }
        } else if (WIFSIGNALED(status)) {
            return Exception;
        } else {
            return WaitError;
        }
    }
    return Timeout;
}